

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long_double>::Add
          (TPZMatrix<long_double> *this,TPZMatrix<long_double> *A,TPZMatrix<long_double> *res)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  int64_t c;
  int64_t r;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar5;
  longdouble in_ST7;
  longdouble lVar6;
  longdouble local_158 [9];
  TPZFMatrix<long_double> local_c0;
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix) <different dimensions>",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar2 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar3 = __dynamic_cast(res,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
    if (lVar3 != 0) {
      lVar3 = __dynamic_cast(A,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
      lVar4 = __dynamic_cast(this,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
      if ((lVar4 == 0) || (lVar3 == 0)) {
        for (lVar3 = 0; lVar3 < (this->super_TPZBaseMatrix).fRow; lVar3 = lVar3 + 1) {
          for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fCol; lVar4 = lVar4 + 1) {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar4)
            ;
            (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar3,lVar4);
            local_158[0] = in_ST0 + in_ST1;
            lVar5 = in_ST7;
            lVar6 = in_ST7;
            (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (res,lVar3,lVar4,local_158);
            in_ST0 = in_ST2;
            in_ST1 = in_ST3;
            in_ST2 = in_ST4;
            in_ST3 = in_ST5;
            in_ST4 = in_ST6;
            in_ST5 = in_ST7;
            in_ST6 = lVar5;
            in_ST7 = lVar6;
          }
        }
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    Storage(&local_c0,A);
    Storage((TPZFMatrixRef<long_double> *)local_158,res);
    TPZFMatrix<long_double>::operator+=
              ((TPZFMatrix<long_double> *)local_158,&local_c0.super_TPZMatrix<long_double>);
    TPZFMatrixRef<long_double>::~TPZFMatrixRef((TPZFMatrixRef<long_double> *)local_158);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "void TPZMatrix<long double>::Add(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = long double]"
                 );
  std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x67c);
}

Assistant:

void TPZMatrix<TVar>::Add(const TPZMatrix<TVar>&A,TPZMatrix<TVar>&res) const {
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix) <different dimensions>" );
	}
  if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)+A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() += A.Storage();
  }
  
}